

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_state.hpp
# Opt level: O0

void __thiscall
duckdb::RegisteredStateManager::Insert
          (RegisteredStateManager *this,string *key,
          shared_ptr<duckdb::ClientContextState,_true> *state_p)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
  *in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_shared_ptr<ClientContextState>_>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  lock_guard<std::mutex> l;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  shared_ptr<duckdb::ClientContextState,_true> *in_stack_ffffffffffffff70;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::make_pair<std::__cxx11::string_const&,duckdb::shared_ptr<duckdb::ClientContextState,true>>
            (&in_RDI->first,in_stack_ffffffffffffff70);
  _Var1 = std::
          unordered_map<std::__cxx11::string,duckdb::shared_ptr<duckdb::ClientContextState,true>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::ClientContextState,true>>>>
          ::
          insert<std::pair<std::__cxx11::string,duckdb::shared_ptr<duckdb::ClientContextState,true>>>
                    (in_RDX,in_RDI);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>
           *)_Var1.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>,_true>
         );
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5a4122);
  return;
}

Assistant:

void Insert(const string &key, shared_ptr<ClientContextState> state_p) {
		lock_guard<mutex> l(lock);
		registered_state.insert(make_pair(key, std::move(state_p)));
	}